

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynom.cpp
# Opt level: O3

Polynom<Rational> __thiscall Polynom<Rational>::power(Polynom<Rational> *this,BigInteger *pow)

{
  compare_t cVar1;
  BigInteger *in_RDX;
  Rational *extraout_RDX;
  bool bVar2;
  Polynom<Rational> PVar3;
  BigInteger p;
  Polynom<Rational> a;
  BigInteger local_98;
  Matrix<Rational> local_78;
  Rational local_68;
  
  BigInteger::BigInteger(&local_68._numerator,1);
  BigInteger::BigInteger(&local_68._denominator,1);
  Polynom(this,&local_68);
  if (local_68._denominator.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68._denominator.digits.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_68._numerator.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68._numerator.digits.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  Matrix<Rational>::Matrix(&local_78,(Matrix<Rational> *)pow);
  BigInteger::BigInteger(&local_68._numerator,0);
  cVar1 = BigInteger::_compare(in_RDX,&local_68._numerator);
  if (cVar1 == CMP_LESS) {
    BigInteger::operator-(&local_98,in_RDX);
  }
  else {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_98.digits,&in_RDX->digits);
    local_98.negative = in_RDX->negative;
  }
  if (local_68._numerator.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68._numerator.digits.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_98.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_98.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar2 = false;
    do {
      if ((*local_98.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start & 1) != 0) {
        if (bVar2) {
          operator*((Polynom<Rational> *)&local_68,this);
          Matrix<Rational>::operator=(&this->m,(Matrix<Rational> *)&local_68);
          Matrix<Rational>::~Matrix((Matrix<Rational> *)&local_68);
          bVar2 = true;
        }
        else {
          bVar2 = true;
          Matrix<Rational>::operator=(&this->m,&local_78);
        }
      }
      BigInteger::_divide_by_2(&local_98);
      if (local_98.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_98.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish) break;
      operator*((Polynom<Rational> *)&local_68,(Polynom<Rational> *)&local_78);
      Matrix<Rational>::operator=(&local_78,(Matrix<Rational> *)&local_68);
      Matrix<Rational>::~Matrix((Matrix<Rational> *)&local_68);
    } while (local_98.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start !=
             local_98.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_finish);
  }
  if (local_98.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  Matrix<Rational>::~Matrix(&local_78);
  PVar3.m.arr = extraout_RDX;
  PVar3.m._0_8_ = this;
  return (Polynom<Rational>)PVar3.m;
}

Assistant:

const Polynom<Field> Polynom<Field>::power(const BigInteger &pow) const
{
    Polynom t = Polynom(Field(1));
    bool t_set = false;
    Polynom a(*this);
    BigInteger p = abs(pow);
    while(p)
    {
        if(p.odd())
        {
            if(t_set)
                t *= a;
            else
                t = a;
            t_set = true;
        }
        p._divide_by_2();
        if(p)
            a *= a;
    }
    return t;
}